

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  TransformerLogLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  ImPlotPoint IVar27;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double in_XMM1_Qa;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  pTVar7 = this->Transformer;
  IVar27.x = (*this->Getter->Getter)(this->Getter->Data,prim + 1);
  pIVar15 = GImPlot;
  dVar11 = log10((double)IVar27.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar15->CurrentPlot;
  dVar1 = pIVar15->LogDenX;
  dVar2 = (pIVar8->XAxis).Range.Min;
  dVar3 = (pIVar8->XAxis).Range.Max;
  dVar12 = log10(in_XMM1_Qa / pIVar8->YAxis[pTVar7->YAxis].Range.Min);
  iVar16 = pTVar7->YAxis;
  pIVar8 = pIVar15->CurrentPlot;
  auVar20._8_8_ = dVar12;
  auVar20._0_8_ = dVar11;
  auVar21._8_4_ = SUB84(pIVar15->LogDenY[iVar16],0);
  auVar21._0_8_ = dVar1;
  auVar21._12_4_ = (int)((ulong)pIVar15->LogDenY[iVar16] >> 0x20);
  auVar21 = divpd(auVar20,auVar21);
  dVar1 = pIVar8->YAxis[iVar16].Range.Min;
  IVar4 = pIVar15->PixelRange[iVar16].Min;
  fVar17 = (float)(pIVar15->Mx *
                   (((double)(float)auVar21._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar8->XAxis).Range.Min) + (double)IVar4.x);
  fVar18 = (float)(pIVar15->My[iVar16] *
                   (((double)(float)auVar21._8_8_ * (pIVar8->YAxis[iVar16].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar19 = (this->P1).x;
  fVar22 = (this->P1).y;
  auVar24._0_4_ = ~-(uint)(fVar17 <= fVar19) & (uint)fVar17;
  auVar24._4_4_ = ~-(uint)(fVar18 <= fVar22) & (uint)fVar18;
  auVar24._8_4_ = ~-(uint)(fVar19 < fVar17) & (uint)fVar17;
  auVar24._12_4_ = ~-(uint)(fVar22 < fVar18) & (uint)fVar18;
  auVar13._4_4_ = (uint)fVar22 & -(uint)(fVar18 <= fVar22);
  auVar13._0_4_ = (uint)fVar19 & -(uint)(fVar17 <= fVar19);
  auVar13._8_4_ = (uint)fVar19 & -(uint)(fVar19 < fVar17);
  auVar13._12_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar18);
  auVar24 = auVar24 | auVar13;
  fVar23 = (cull_rect->Min).y;
  auVar14._4_8_ = auVar24._8_8_;
  auVar14._0_4_ = -(uint)(auVar24._4_4_ < fVar23);
  auVar25._0_8_ = auVar14._0_8_ << 0x20;
  auVar25._8_4_ = -(uint)(auVar24._8_4_ < (cull_rect->Max).x);
  auVar25._12_4_ = -(uint)(auVar24._12_4_ < (cull_rect->Max).y);
  auVar26._4_4_ = -(uint)(fVar23 < auVar24._4_4_);
  auVar26._0_4_ = -(uint)((cull_rect->Min).x < auVar24._0_4_);
  auVar26._8_8_ = auVar25._8_8_;
  iVar16 = movmskps((int)pIVar8,auVar26);
  if (iVar16 == 0xf) {
    fVar23 = fVar22 + this->HalfWeight;
    fVar22 = fVar22 - this->HalfWeight;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    (pIVar9->pos).x = fVar19;
    (pIVar9->pos).y = fVar23;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar5;
    pIVar9[1].pos.x = fVar17;
    pIVar9[1].pos.y = fVar22;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar5;
    pIVar9[2].pos.x = fVar19;
    pIVar9[2].pos.y = fVar22;
    pIVar9[2].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar5;
    pIVar9[3].pos.x = fVar17;
    pIVar9[3].pos.y = fVar23;
    pIVar9[3].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar10 = DrawList->_IdxWritePtr;
    *puVar10 = uVar6;
    puVar10[1] = uVar6 + 1;
    puVar10[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar10[3] = uVar6;
    puVar10[4] = uVar6 + 1;
    puVar10[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar10 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar22 = fVar17 - this->HalfWeight;
    fVar19 = this->HalfWeight + fVar17;
    fVar23 = (this->P1).y;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar9[4].pos.x = fVar22;
    pIVar9[4].pos.y = fVar18;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar5;
    pIVar9[1].pos.x = fVar19;
    pIVar9[1].pos.y = fVar23;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar5;
    pIVar9[2].pos.x = fVar22;
    pIVar9[2].pos.y = fVar23;
    pIVar9[2].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar5;
    pIVar9[3].pos.x = fVar19;
    pIVar9[3].pos.y = fVar18;
    pIVar9[3].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar10 = DrawList->_IdxWritePtr;
    *puVar10 = uVar6;
    puVar10[1] = uVar6 + 1;
    puVar10[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar10[3] = uVar6;
    puVar10[4] = uVar6 + 1;
    puVar10[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar10 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar4.y = fVar18;
  IVar4.x = fVar17;
  this->P1 = IVar4;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }